

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::iterate(MaskConstancyCase *this)

{
  uint uVar1;
  TestLog *pTVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  uint uVar6;
  Surface *surface;
  void *__buf;
  int iVar7;
  bool *pbVar8;
  int iVar9;
  bool *pbVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Vec2 local_2b0;
  Vec2 local_2a8;
  Vec2 local_2a0;
  Vec2 local_298;
  ulong local_290;
  Vector<float,_4> local_288;
  uint local_274;
  uint local_270;
  float local_26c;
  float local_268;
  float local_264;
  Surface renderedImg;
  undefined1 local_238 [12];
  float local_22c;
  Vec4 local_218;
  string local_208;
  tcu local_1e8 [16];
  tcu local_1d8 [16];
  tcu local_1c8 [16];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  
  iVar3 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar3);
  pTVar2 = ((this->super_DefaultFBOMultisampleCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  iVar3 = (this->super_DefaultFBOMultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImg,iVar3,iVar3);
  DefaultFBOMultisampleCase::randomizeViewport(&this->super_DefaultFBOMultisampleCase);
  local_1b8 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,"Clearing color to black");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  (**(code **)(lVar14 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar14 + 0x188))(0x4000);
  dVar4 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar4,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x2f5);
  if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') {
    (**(code **)(lVar14 + 0x5e0))(0x809e);
    (**(code **)(lVar14 + 0x238))(1,1,1,0);
    dVar4 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_ALPHA_TO_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x2fb);
    local_1b8 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    local_1b8 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"Color mask is TRUE, TRUE, TRUE, FALSE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
    (**(code **)(lVar14 + 0x5e0))(0x80a0);
    dVar4 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x304);
    local_1b8 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"GL_SAMPLE_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  }
  if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
    (**(code **)(lVar14 + 0x5e0))(0x8e51);
    dVar4 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar4,"enable GL_SAMPLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x30c);
    local_1b8 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::operator<<((ostream *)&pp_Stack_1b0,"GL_SAMPLE_MASK is enabled");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  }
  local_1b8 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::operator<<((ostream *)&pp_Stack_1b0,
                  "Drawing several green quads, each fully overlapped by a red quad with the same ")
  ;
  pbVar8 = glcts::fixed_sample_locations_values + 1;
  pbVar10 = glcts::fixed_sample_locations_values + 1;
  if ((this->super_DefaultFBOMultisampleCase).field_0xb1 != '\0') {
    pbVar10 = (bool *)0x166fb87;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pbVar10);
  if ((((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\x01') &&
      (pbVar8 = (bool *)0x1815908, (this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0')) &&
     (pbVar8 = glcts::fixed_sample_locations_values + 1,
     (this->super_DefaultFBOMultisampleCase).field_0xb4 != '\0')) {
    pbVar8 = (bool *)0x1815908;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pbVar8);
  pcVar11 = "inverted ";
  if ((this->super_DefaultFBOMultisampleCase).field_0xb3 == '\0') {
    pcVar11 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pcVar11);
  pbVar8 = (bool *)0x18b1604;
  if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\0') {
    pbVar8 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pbVar8);
  pbVar8 = glcts::fixed_sample_locations_values + 1;
  if (((this->super_DefaultFBOMultisampleCase).field_0xb2 &
      (this->super_DefaultFBOMultisampleCase).field_0xb4) != 0) {
    pbVar8 = (bool *)0x1815908;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pbVar8);
  pcVar11 = "sample mask";
  if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\0') {
    pcVar11 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)&pp_Stack_1b0,pcVar11);
  std::operator<<((ostream *)&pp_Stack_1b0," values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  iVar3 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
  uVar1 = iVar3 * 4;
  fVar18 = (float)(int)uVar1;
  fVar19 = (float)(iVar3 * 4 + -1);
  local_26c = (float)(int)(uVar1 * uVar1 + -1);
  local_274 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    local_274 = uVar1;
  }
  while (uVar16 = uVar5, pbVar8 = glcts::fixed_sample_locations_values + 1, uVar16 != local_274) {
    fVar21 = (float)(int)uVar16 / fVar18;
    local_270 = uVar16 + 1;
    fVar21 = fVar21 + fVar21 + -1.0;
    fVar23 = (float)(int)local_270 / fVar18 + (float)(int)local_270 / fVar18 + -1.0;
    local_268 = (float)(int)uVar16 / fVar19;
    local_290 = 0;
    while (uVar6 = (uint)local_290, uVar5 = local_270, uVar6 != uVar1) {
      local_1b8 = (undefined1  [8])0x3f80000000000000;
      pp_Stack_1b0 = (_func_int **)0x0;
      local_208._M_dataplus._M_p = (pointer)0x3f800000;
      local_208._M_string_length = 0;
      if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\0') {
        local_22c = 1.0;
        local_288.m_data[3] = 1.0;
      }
      else {
        local_22c = (float)(int)uVar6 / fVar19;
        local_288.m_data[3] = local_268;
      }
      local_238._0_8_ = (pointer)0x0;
      local_238._8_4_ = 0.0;
      local_288.m_data[0] = 0.0;
      local_288.m_data[1] = 0.0;
      local_288.m_data[2] = 0.0;
      if ((this->super_DefaultFBOMultisampleCase).field_0xb2 == '\x01') {
        fVar20 = (float)(int)(uVar16 * uVar1 + uVar6) / local_26c;
        if ((this->super_DefaultFBOMultisampleCase).field_0xb3 != '\0') {
          fVar20 = 1.0 - fVar20;
        }
        (**(code **)(lVar14 + 0x1250))(fVar20);
        dVar4 = (**(code **)(lVar14 + 0x800))();
        glu::checkError(dVar4,"glSampleCoverage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                        ,0x32f);
      }
      if ((this->super_DefaultFBOMultisampleCase).field_0xb4 == '\x01') {
        iVar15 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
        iVar3 = iVar15 + -1;
        iVar9 = iVar3 / 0x20;
        iVar15 = (iVar3 / -0x20) * 0x20 + iVar15;
        iVar3 = -1;
        if (-1 < iVar9) {
          iVar3 = iVar9;
        }
        for (iVar7 = 0; iVar3 + 1 != iVar7; iVar7 = iVar7 + 1) {
          dVar4 = deUint32Hash((int)local_290 <<
                               ((byte)((this->super_DefaultFBOMultisampleCase).m_numSamples / 2) &
                               0x1f) ^ uVar16);
          uVar5 = 0xffffffff;
          if (iVar9 == iVar7) {
            uVar5 = ~(-1 << ((byte)iVar15 & 0x1f));
          }
          if (0x1f < iVar15) {
            uVar5 = 0xffffffff;
          }
          (**(code **)(lVar14 + 0x1258))(iVar7,uVar5 & dVar4);
          dVar4 = (**(code **)(lVar14 + 0x800))();
          glu::checkError(dVar4,"glSampleMaski",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                          ,0x33f);
        }
      }
      fVar20 = (float)(int)uVar6 / fVar18;
      uVar5 = (int)local_290 + 1;
      local_290 = (ulong)uVar5;
      fVar20 = fVar20 + fVar20 + -1.0;
      fVar22 = (float)(int)uVar5 / fVar18;
      local_2b0.m_data[0] = fVar22 + fVar22 + -1.0;
      local_2b0.m_data[1] = fVar23;
      local_2a8.m_data[0] = fVar20;
      local_2a8.m_data[1] = fVar23;
      local_2a0.m_data[0] = local_2b0.m_data[0];
      local_2a0.m_data[1] = fVar21;
      local_298.m_data[0] = fVar20;
      local_298.m_data[1] = fVar21;
      local_264 = local_2b0.m_data[0];
      tcu::operator+(local_1e8,(Vector<float,_4> *)local_1b8,(Vector<float,_4> *)local_238);
      tcu::operator+(local_1c8,(Vector<float,_4> *)local_1b8,&local_288);
      tcu::operator+((tcu *)&local_218,(Vector<float,_4> *)local_1b8,(Vector<float,_4> *)local_238);
      tcu::operator+(local_1d8,(Vector<float,_4> *)local_1b8,&local_288);
      DefaultFBOMultisampleCase::renderQuad
                (&this->super_DefaultFBOMultisampleCase,&local_298,&local_2a0,&local_2a8,&local_2b0,
                 (Vec4 *)local_1e8,(Vec4 *)local_1c8,&local_218,(Vec4 *)local_1d8);
      local_2a0.m_data[0] = local_264;
      local_2b0.m_data[0] = local_264;
      local_2b0.m_data[1] = fVar23;
      local_2a8.m_data[0] = fVar20;
      local_2a8.m_data[1] = fVar23;
      local_2a0.m_data[1] = fVar21;
      local_298.m_data[0] = fVar20;
      local_298.m_data[1] = fVar21;
      tcu::operator+(local_1e8,(Vector<float,_4> *)&local_208,(Vector<float,_4> *)local_238);
      tcu::operator+(local_1c8,(Vector<float,_4> *)&local_208,&local_288);
      tcu::operator+((tcu *)&local_218,(Vector<float,_4> *)&local_208,(Vector<float,_4> *)local_238)
      ;
      tcu::operator+(local_1d8,(Vector<float,_4> *)&local_208,&local_288);
      DefaultFBOMultisampleCase::renderQuad
                (&this->super_DefaultFBOMultisampleCase,&local_298,&local_2a0,&local_2a8,&local_2b0,
                 (Vec4 *)local_1e8,(Vec4 *)local_1c8,&local_218,(Vec4 *)local_1d8);
    }
  }
  DefaultFBOMultisampleCase::readImage(&this->super_DefaultFBOMultisampleCase,&renderedImg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"RenderedImage",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"Rendered image",(allocator<char> *)local_1e8);
  surface = &renderedImg;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b8,&local_208,(string *)local_238,surface,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar2,__buf,(size_t)surface);
  tcu::LogImage::~LogImage((LogImage *)local_1b8);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string((string *)&local_208);
  iVar3 = 0;
  uVar12 = 0;
  if (0 < renderedImg.m_width) {
    uVar12 = (ulong)(uint)renderedImg.m_width;
  }
  if (renderedImg.m_height < 1) {
    renderedImg.m_height = 0;
  }
  iVar15 = 0;
  do {
    uVar13 = uVar12;
    iVar9 = iVar3;
    if (iVar15 == renderedImg.m_height) {
      local_1b8 = (undefined1  [8])pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::operator<<((ostream *)&pp_Stack_1b0,
                      "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
                     );
      pbVar10 = (bool *)0x166fb87;
      if ((this->super_DefaultFBOMultisampleCase).field_0xb1 == '\0') {
        pbVar10 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)&pp_Stack_1b0,pbVar10);
      pbVar10 = (bool *)0x1815908;
      if (((this->super_DefaultFBOMultisampleCase).field_0xb1 &
          (this->super_DefaultFBOMultisampleCase).field_0xb2) == 0) {
        pbVar10 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)&pp_Stack_1b0,pbVar10);
      if ((this->super_DefaultFBOMultisampleCase).field_0xb2 != '\0') {
        pbVar8 = (bool *)0x1817002;
      }
      std::operator<<((ostream *)&pp_Stack_1b0,pbVar8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      tcu::TestContext::setTestResult
                (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx,
                 QP_TEST_RESULT_PASS,"Passed");
LAB_012d00f2:
      tcu::Surface::~Surface(&renderedImg);
      return STOP;
    }
    while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
      lVar14 = (long)iVar9;
      iVar9 = iVar9 + 1;
      if (*(char *)((long)renderedImg.m_pixels.m_ptr + lVar14 * 4 + 1) != '\0') {
        local_1b8 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
        std::operator<<((ostream *)&pp_Stack_1b0,
                        "Failure: Non-zero green color component detected - should have been completely overwritten by red quad"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
        tcu::TestContext::setTestResult
                  (((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_testCtx,
                   QP_TEST_RESULT_FAIL,"Failed");
        goto LAB_012d00f2;
      }
    }
    iVar15 = iVar15 + 1;
    iVar3 = iVar3 + renderedImg.m_width;
  } while( true );
}

Assistant:

MaskConstancyCase::IterateResult MaskConstancyCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	tcu::Surface			renderedImg		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	if (m_isAlphaToCoverageCase)
	{
		gl.enable(GL_SAMPLE_ALPHA_TO_COVERAGE);
		gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_ALPHA_TO_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
		log << TestLog::Message << "Color mask is TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	if (m_isSampleCoverageCase)
	{
		gl.enable(GL_SAMPLE_COVERAGE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	if (m_isSampleMaskCase)
	{
		gl.enable(GL_SAMPLE_MASK);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_MASK");

		log << TestLog::Message << "GL_SAMPLE_MASK is enabled" << TestLog::EndMessage;
	}

	log << TestLog::Message
		<< "Drawing several green quads, each fully overlapped by a red quad with the same "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && (m_isSampleCoverageCase || m_isSampleMaskCase) ? " and " : "")
		<< (m_isInvertedSampleCoverageCase ? "inverted " : "")
		<< (m_isSampleCoverageCase ? "sample coverage" : "")
		<< (m_isSampleCoverageCase && m_isSampleMaskCase ? " and " : "")
		<< (m_isSampleMaskCase ? "sample mask" : "")
		<< " values"
		<< TestLog::EndMessage;

	const int numQuadRowsCols = m_numSamples*4;

	for (int row = 0; row < numQuadRowsCols; row++)
	{
		for (int col = 0; col < numQuadRowsCols; col++)
		{
			float		x0			= (float)(col+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		x1			= (float)(col+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y0			= (float)(row+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y1			= (float)(row+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			const Vec4	baseGreen	(0.0f, 1.0f, 0.0f, 0.0f);
			const Vec4	baseRed		(1.0f, 0.0f, 0.0f, 0.0f);
			Vec4		alpha0		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)col / (float)(numQuadRowsCols-1) : 1.0f);
			Vec4		alpha1		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)row / (float)(numQuadRowsCols-1) : 1.0f);

			if (m_isSampleCoverageCase)
			{
				float value = (float)(row*numQuadRowsCols + col) / (float)(numQuadRowsCols*numQuadRowsCols-1);
				gl.sampleCoverage(m_isInvertedSampleCoverageCase ? 1.0f - value : value, m_isInvertedSampleCoverageCase ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleCoverage");
			}

			if (m_isSampleMaskCase)
			{
				const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
				const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
				const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

				for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
				{
					const GLbitfield	mask		= (GLbitfield)deUint32Hash((col << (m_numSamples / 2)) ^ row);
					const bool			isFinalWord	= (wordNdx + 1) == wordCount;
					const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

					gl.sampleMaski(wordNdx, mask & maskMask);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");
				}
			}

			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseGreen + alpha0,	baseGreen + alpha1,	baseGreen + alpha0,	baseGreen + alpha1);
			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseRed + alpha0,	baseRed + alpha1,	baseRed + alpha0,	baseRed + alpha1);
		}
	}

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
	{
		if (renderedImg.getPixel(x, y).getGreen() > 0)
		{
			log << TestLog::Message << "Failure: Non-zero green color component detected - should have been completely overwritten by red quad" << TestLog::EndMessage;
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
			return STOP;
		}
	}

	log << TestLog::Message
		<< "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && m_isSampleCoverageCase ? " and " : "")
		<< (m_isSampleCoverageCase ? "coverage value" : "")
		<< TestLog::EndMessage;

	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");

	return STOP;
}